

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjgc.cpp
# Opt level: O2

size_t __thiscall DSectorMarker::PropagateMark(DSectorMarker *this)

{
  uint32 *puVar1;
  sector_t_conflict *psVar2;
  side_t *psVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  
  if (sectors == (sector_t_conflict *)0x0) {
    iVar5 = 0;
LAB_00391f76:
    if (polyobjs != (FPolyObj *)0x0) {
      iVar7 = 0;
      while( true ) {
        if ((iVar7 == 0x78) || (iVar4 = iVar7 + this->PolyNum, po_NumPolyobjs <= iVar4)) break;
        GC::Mark((DObject **)&polyobjs[iVar4].interpolation);
        iVar7 = iVar7 + 1;
        iVar5 = iVar5 + 0xf0;
      }
      iVar7 = iVar7 + this->PolyNum;
      if (iVar7 < po_NumPolyobjs) {
        this->PolyNum = iVar7;
        goto LAB_0039204f;
      }
    }
    if (sides == (side_t *)0x0) goto LAB_00392065;
    iVar7 = 0;
    while( true ) {
      psVar3 = sides;
      if ((iVar7 == 0xf0) || (iVar4 = this->SideNum + iVar7, numsides <= iVar4)) break;
      for (lVar6 = 0x38; lVar6 != 200; lVar6 = lVar6 + 0x30) {
        GC::Mark((DObject **)((long)psVar3[iVar4].textures + lVar6 + -0x10));
      }
      iVar7 = iVar7 + 1;
    }
    iVar5 = iVar7 * 0xc0 + iVar5;
    iVar7 = this->SideNum + iVar7;
    if (numsides <= iVar7) goto LAB_00392065;
    this->SideNum = iVar7;
  }
  else {
    iVar7 = 0;
    while( true ) {
      psVar2 = sectors;
      iVar4 = *(int *)&(this->super_DObject).field_0x24;
      if ((iVar7 == 0x20) || (iVar5 = iVar4 + iVar7, numsectors <= iVar5)) break;
      GC::Mark((DObject **)&sectors[iVar5].SoundTarget);
      GC::Mark((DObject **)&psVar2[iVar5].SecActTarget);
      GC::Mark((DObject **)&psVar2[iVar5].floordata);
      GC::Mark((DObject **)&psVar2[iVar5].ceilingdata);
      GC::Mark((DObject **)&psVar2[iVar5].lightingdata);
      for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
        GC::Mark((DObject **)((long)&psVar2[iVar5].interpolations[0].field_0 + lVar6));
      }
      iVar7 = iVar7 + 1;
    }
    iVar5 = iVar7 * 0x218;
    iVar4 = iVar4 + iVar7;
    if (numsectors <= iVar4) goto LAB_00391f76;
    *(int *)&(this->super_DObject).field_0x24 = iVar4;
  }
LAB_0039204f:
  puVar1 = &(this->super_DObject).ObjectFlags;
  *(byte *)puVar1 = (byte)*puVar1 & 0xfb;
  (this->super_DObject).GCNext = &GC::Gray->super_DObject;
  GC::Gray = this;
LAB_00392065:
  return (long)iVar5;
}

Assistant:

size_t DSectorMarker::PropagateMark()
{
	int i;
	int marked = 0;
	bool moretodo = false;

	if (sectors != NULL)
	{
		for (i = 0; i < SECTORSTEPSIZE && SecNum + i < numsectors; ++i)
		{
			sector_t *sec = &sectors[SecNum + i];
			GC::Mark(sec->SoundTarget);
			GC::Mark(sec->SecActTarget);
			GC::Mark(sec->floordata);
			GC::Mark(sec->ceilingdata);
			GC::Mark(sec->lightingdata);
			for(int j=0;j<4;j++) GC::Mark(sec->interpolations[j]);
		}
		marked += i * sizeof(sector_t);
		if (SecNum + i < numsectors)
		{
			SecNum += i;
			moretodo = true;
		}
	}
	if (!moretodo && polyobjs != NULL)
	{
		for (i = 0; i < POLYSTEPSIZE && PolyNum + i < po_NumPolyobjs; ++i)
		{
			GC::Mark(polyobjs[PolyNum + i].interpolation);
		}
		marked += i * sizeof(FPolyObj);
		if (PolyNum + i < po_NumPolyobjs)
		{
			PolyNum += i;
			moretodo = true;
		}
	}
	if (!moretodo && sides != NULL)
	{
		for (i = 0; i < SIDEDEFSTEPSIZE && SideNum + i < numsides; ++i)
		{
			side_t *side = &sides[SideNum + i];
			for(int j=0;j<3;j++) GC::Mark(side->textures[j].interpolation);
		}
		marked += i * sizeof(side_t);
		if (SideNum + i < numsides)
		{
			SideNum += i;
			moretodo = true;
		}
	}
	// If there are more sectors to mark, put ourself back into the gray
	// list.
	if (moretodo)
	{
		Black2Gray();
		GCNext = GC::Gray;
		GC::Gray = this;
	}
	return marked;
}